

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

char * __thiscall
flatbuffers::JsonPrinter::GenFieldOffset
          (JsonPrinter *this,FieldDef *fd,Table *table,bool fixed,int indent,uint8_t *prev_val)

{
  bool bVar1;
  uint uVar2;
  uchar *puVar3;
  Vector<unsigned_char,_unsigned_int> *this_00;
  Table *table_00;
  char *pcVar4;
  Vector<unsigned_char,_unsigned_int> *local_88;
  bool local_71;
  Table *root_1;
  Vector<unsigned_char,_unsigned_int> *vec_1;
  Reference root;
  Vector<unsigned_char,_unsigned_int> *vec;
  void *val;
  uint8_t *prev_val_local;
  int indent_local;
  bool fixed_local;
  Table *table_local;
  FieldDef *fd_local;
  JsonPrinter *this_local;
  
  if (fixed) {
    bVar1 = IsStruct(&(fd->value).type);
    local_71 = true;
    if (!bVar1) {
      local_71 = IsArray(&(fd->value).type);
    }
    if (local_71 == false) {
      __assert_fail("IsStruct(fd.value.type) || IsArray(fd.value.type)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_text.cpp"
                    ,0x11a,
                    "const char *flatbuffers::JsonPrinter::GenFieldOffset(const FieldDef &, const Table *, bool, int, const uint8_t *)"
                   );
    }
    vec = (Vector<unsigned_char,_unsigned_int> *)
          Struct::GetStruct<void_const*>((Struct *)table,(uint)(fd->value).offset);
  }
  else {
    if (((fd->flexbuffer & 1U) != 0) && ((this->opts->json_nested_flexbuffers & 1U) != 0)) {
      root._8_8_ = Table::
                   GetPointer<flatbuffers::Vector<unsigned_char,unsigned_int>const*,unsigned_int>
                             (table,(fd->value).offset);
      puVar3 = Vector<unsigned_char,_unsigned_int>::data
                         ((Vector<unsigned_char,_unsigned_int> *)root._8_8_);
      uVar2 = Vector<unsigned_char,_unsigned_int>::size
                        ((Vector<unsigned_char,_unsigned_int> *)root._8_8_);
      _vec_1 = flexbuffers::GetRoot(puVar3,(ulong)uVar2);
      flexbuffers::Reference::ToString
                ((Reference *)&vec_1,true,(bool)(this->opts->strict_json & 1),this->text);
      return (char *)0x0;
    }
    if ((fd->nested_flatbuffer != (StructDef *)0x0) &&
       ((this->opts->json_nested_flatbuffers & 1U) != 0)) {
      this_00 = Table::
                GetPointer<flatbuffers::Vector<unsigned_char,unsigned_int>const*,unsigned_int>
                          (table,(fd->value).offset);
      puVar3 = Vector<unsigned_char,_unsigned_int>::data(this_00);
      table_00 = GetRoot<flatbuffers::Table>(puVar3);
      pcVar4 = GenStruct(this,fd->nested_flatbuffer,table_00,indent);
      return pcVar4;
    }
    bVar1 = IsStruct(&(fd->value).type);
    if (bVar1) {
      local_88 = (Vector<unsigned_char,_unsigned_int> *)
                 Table::GetStruct<void_const*>(table,(fd->value).offset);
    }
    else {
      local_88 = (Vector<unsigned_char,_unsigned_int> *)
                 Table::GetPointer<void_const*,unsigned_int>(table,(fd->value).offset);
    }
    vec = local_88;
  }
  pcVar4 = PrintOffset(this,vec,&(fd->value).type,indent,prev_val,-1);
  return pcVar4;
}

Assistant:

const char *GenFieldOffset(const FieldDef &fd, const Table *table, bool fixed,
                             int indent, const uint8_t *prev_val) {
    const void *val = nullptr;
    if (fixed) {
      // The only non-scalar fields in structs are structs or arrays.
      FLATBUFFERS_ASSERT(IsStruct(fd.value.type) || IsArray(fd.value.type));
      val = reinterpret_cast<const Struct *>(table)->GetStruct<const void *>(
          fd.value.offset);
    } else if (fd.flexbuffer && opts.json_nested_flexbuffers) {
      // We could verify this FlexBuffer before access, but since this sits
      // inside a FlatBuffer that we don't know wether it has been verified or
      // not, there is little point making this part safer than the parent..
      // The caller should really be verifying the whole.
      // If the whole buffer is corrupt, we likely crash before we even get
      // here.
      auto vec = table->GetPointer<const Vector<uint8_t> *>(fd.value.offset);
      auto root = flexbuffers::GetRoot(vec->data(), vec->size());
      root.ToString(true, opts.strict_json, text);
      return nullptr;
    } else if (fd.nested_flatbuffer && opts.json_nested_flatbuffers) {
      auto vec = table->GetPointer<const Vector<uint8_t> *>(fd.value.offset);
      auto root = GetRoot<Table>(vec->data());
      return GenStruct(*fd.nested_flatbuffer, root, indent);
    } else {
      val = IsStruct(fd.value.type)
                ? table->GetStruct<const void *>(fd.value.offset)
                : table->GetPointer<const void *>(fd.value.offset);
    }
    return PrintOffset(val, fd.value.type, indent, prev_val, -1);
  }